

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::section(BaseBuilder *this,Section *section)

{
  bool bVar1;
  BaseBuilder *in_RSI;
  BaseBuilder *in_RDI;
  Error _err;
  SectionNode *node;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  Error local_44;
  
  local_44 = sectionNodeOf(in_RDI,(SectionNode **)in_RSI,in_stack_ffffffffffffffa4);
  if (local_44 == 0) {
    bVar1 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                      (*(NodeFlags *)
                        (CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) + 0x11),
                       kIsActive);
    if (bVar1) {
      if ((in_RDI->_dirtySectionLinks & 1U) != 0) {
        updateSectionLinks(in_RDI);
      }
      if (*(long *)(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) + 0x38) == 0) {
        in_RDI->_cursor = *(BaseNode **)&in_RDI->field_0x1a8;
      }
      else {
        in_RDI->_cursor =
             (BaseNode *)
             **(undefined8 **)(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) + 0x38)
        ;
      }
    }
    else {
      addAfter(in_RSI,(BaseNode *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (BaseNode *)CONCAT44(local_44,in_stack_ffffffffffffff98));
      in_RDI->_cursor = (BaseNode *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    }
    local_44 = 0;
  }
  return local_44;
}

Assistant:

Error BaseBuilder::section(Section* section) {
  SectionNode* node;
  ASMJIT_PROPAGATE(sectionNodeOf(&node, section->id()));
  ASMJIT_ASSUME(node != nullptr);

  if (!node->isActive()) {
    // Insert the section at the end if it was not part of the code.
    addAfter(node, lastNode());
    _cursor = node;
  }
  else {
    // This is a bit tricky. We cache section links to make sure that
    // switching sections doesn't involve traversal in linked-list unless
    // the position of the section has changed.
    if (hasDirtySectionLinks())
      updateSectionLinks();

    if (node->_nextSection)
      _cursor = node->_nextSection->_prev;
    else
      _cursor = _nodeList.last();
  }

  return kErrorOk;
}